

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall re2::DFA::StateEqual::operator()(StateEqual *this,State *a,State *b)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (a == b) {
    return true;
  }
  if (b != (State *)0x0 && a != (State *)0x0) {
    uVar1 = a->ninst_;
    if ((uVar1 == b->ninst_) && (a->flag_ == b->flag_)) {
      bVar4 = (int)uVar1 < 1;
      if (0 < (int)uVar1) {
        if (*a->inst_ == *b->inst_) {
          uVar2 = 1;
          do {
            uVar3 = uVar2;
            if (uVar1 == uVar3) break;
            uVar2 = uVar3 + 1;
          } while (a->inst_[uVar3] == b->inst_[uVar3]);
          bVar4 = uVar1 <= uVar3;
        }
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool operator()(const State* a, const State* b) const {
      if (a == b)
        return true;
      if (a == NULL || b == NULL)
        return false;
      if (a->ninst_ != b->ninst_)
        return false;
      if (a->flag_ != b->flag_)
        return false;
      for (int i = 0; i < a->ninst_; i++)
        if (a->inst_[i] != b->inst_[i])
          return false;
      return true;  // they're equal
    }